

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  __base_type _Var4;
  int i;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Node *prev [12];
  Node *local_88 [13];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar3 = FindGreaterOrEqual(this,key,local_88);
  if (pNVar3 != (Node *)0x0) {
    iVar1 = MemTable::KeyComparator::operator()(&this->compare_,*key,pNVar3->key);
    if (iVar1 == 0) {
      __assert_fail("x == nullptr || !Equal(key, x->key)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/skiplist.h"
                    ,0x158,
                    "void leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Insert(const Key &) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
  }
  uVar5 = (this->rnd_).seed_;
  uVar2 = 1;
  do {
    uVar6 = (uint)((ulong)uVar5 * 0x41a7) & 0x7fffffff;
    iVar1 = (int)((ulong)uVar5 * 0x41a7 >> 0x1f);
    uVar7 = iVar1 + uVar6;
    uVar5 = iVar1 + uVar6 + 0x80000001;
    if (-1 < (int)uVar7) {
      uVar5 = uVar7;
    }
    if ((uVar5 & 3) != 0) goto LAB_00cf8032;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0xc);
  uVar2 = 0xc;
LAB_00cf8032:
  (this->rnd_).seed_ = uVar5;
  if ((this->max_height_).super___atomic_base<int>._M_i < (int)uVar2) {
    iVar1 = (this->max_height_).super___atomic_base<int>._M_i;
    if (iVar1 < (int)uVar2) {
      lVar8 = (long)iVar1;
      pNVar3 = this->head_;
      lVar9 = (ulong)uVar2 - lVar8;
      lVar10 = lVar9 + -1;
      auVar12._8_4_ = (int)lVar10;
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar11 = 0;
      auVar12 = auVar12 ^ _DAT_00e4a2c0;
      do {
        auVar13._8_4_ = (int)uVar11;
        auVar13._0_8_ = uVar11;
        auVar13._12_4_ = (int)(uVar11 >> 0x20);
        auVar13 = (auVar13 | _DAT_00e4a2b0) ^ _DAT_00e4a2c0;
        if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                    auVar12._4_4_ < auVar13._4_4_) & 1)) {
          local_88[lVar8 + uVar11] = pNVar3;
        }
        if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
            auVar13._12_4_ <= auVar12._12_4_) {
          local_88[lVar8 + uVar11 + 1] = pNVar3;
        }
        uVar11 = uVar11 + 2;
      } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar11);
    }
    (this->max_height_).super___atomic_base<int>._M_i = uVar2;
  }
  _Var4._M_p = (__pointer_type)Arena::AllocateAligned(this->arena_,(long)(int)uVar2 * 8 + 8);
  (_Var4._M_p)->key = *key;
  (_Var4._M_p)->next_[0]._M_b = (__base_type)0x0;
  uVar11 = 0;
  do {
    pNVar3 = local_88[uVar11];
    *(__pointer_type *)((long)(_Var4._M_p)->next_ + uVar11 * 8) = pNVar3->next_[uVar11]._M_b._M_p;
    pNVar3->next_[uVar11]._M_b._M_p = _Var4._M_p;
    uVar11 = uVar11 + 1;
  } while (uVar2 != uVar11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SkipList<Key, Comparator>::Insert(const Key& key) {
  // TODO(opt): We can use a barrier-free variant of FindGreaterOrEqual()
  // here since Insert() is externally synchronized.
  Node* prev[kMaxHeight];
  Node* x = FindGreaterOrEqual(key, prev);

  // Our data structure does not allow duplicate insertion
  assert(x == nullptr || !Equal(key, x->key));

  int height = RandomHeight();
  if (height > GetMaxHeight()) {
    for (int i = GetMaxHeight(); i < height; i++) {
      prev[i] = head_;
    }
    // It is ok to mutate max_height_ without any synchronization
    // with concurrent readers.  A concurrent reader that observes
    // the new value of max_height_ will see either the old value of
    // new level pointers from head_ (nullptr), or a new value set in
    // the loop below.  In the former case the reader will
    // immediately drop to the next level since nullptr sorts after all
    // keys.  In the latter case the reader will use the new node.
    max_height_.store(height, std::memory_order_relaxed);
  }

  x = NewNode(key, height);
  for (int i = 0; i < height; i++) {
    // NoBarrier_SetNext() suffices since we will add a barrier when
    // we publish a pointer to "x" in prev[i].
    x->NoBarrier_SetNext(i, prev[i]->NoBarrier_Next(i));
    prev[i]->SetNext(i, x);
  }
}